

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# calculation.c
# Opt level: O1

void fill_approximation(double *G,double *V,double *solutions,uint total_values)

{
  ulong uVar1;
  
  if (total_values != 0) {
    uVar1 = 0;
    do {
      *(double *)((long)G + uVar1 * 4) = solutions[uVar1 & 0xffffffff];
      *(double *)((long)V + uVar1 * 4) = solutions[(int)uVar1 + 1];
      uVar1 = uVar1 + 2;
    } while ((ulong)total_values * 2 != uVar1);
  }
  V[total_values - 1] = 0.0;
  *V = 0.0;
  return;
}

Assistant:

void fill_approximation (double * G, double * V, double const * solutions, unsigned total_values) {
  register unsigned space_step = 0;

  for (space_step = 0; space_step < total_values; ++space_step) {
    G[space_step] = solutions[G_INDEX(space_step)];
    V[space_step] = solutions[V_INDEX(space_step)];
  }
  V[0] = V[total_values - 1] = 0.;

  return;
}